

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

int ON_SubDFaceCornerDex::Compare(ON_SubDFaceCornerDex *lhs,ON_SubDFaceCornerDex *rhs)

{
  ON_SubDFaceCornerDex *rhs_local;
  ON_SubDFaceCornerDex *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_SubDFaceCornerDex *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_SubDFaceCornerDex *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    lhs_local._4_4_ = CompareAll(lhs,rhs);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_SubDFaceCornerDex::Compare(const ON_SubDFaceCornerDex* lhs, const ON_SubDFaceCornerDex* rhs)
{
  // sort nullptr to end
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  return ON_SubDFaceCornerDex::CompareAll(*lhs, *rhs);
}